

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_pubsub_attach(fio_pubsub_engine_s *engine)

{
  uintptr_t uVar1;
  fio_engine_set__ordered_s_ *pfVar2;
  fio_engine_set__map_s_ *pfVar3;
  fio_pubsub_engine_s *obj;
  fio_pubsub_engine_s *extraout_RDX;
  fio_engine_set_s *pfVar4;
  fio_engine_set_s *set;
  fio_lock_i ret;
  
  pfVar4 = (fio_engine_set_s *)&fio_postoffice.engines.lock;
  fio_lock(&fio_postoffice.engines.lock);
  set = (fio_engine_set_s *)(-(ulong)(engine == (fio_pubsub_engine_s *)0x0) | (ulong)engine);
  obj = (fio_pubsub_engine_s *)(fio_postoffice.engines.set.pos - fio_postoffice.engines.set.count);
  if (obj <= (fio_pubsub_engine_s *)(fio_postoffice.engines.set.count >> 1)) {
    if (fio_postoffice.engines.set.pos < fio_postoffice.engines.set.capa) goto LAB_0010a56c;
    fio_postoffice.engines.set.used_bits = fio_postoffice.engines.set.used_bits + '\x01';
  }
  fio_engine_set_rehash(pfVar4);
  obj = extraout_RDX;
LAB_0010a56c:
  pfVar4 = set;
  pfVar3 = fio_engine_set__find_map_pos_(set,(uintptr_t)engine,obj);
  pfVar2 = fio_postoffice.engines.set.ordered;
  uVar1 = fio_postoffice.engines.set.pos;
  if (pfVar3 == (fio_engine_set__map_s_ *)0x0) {
    fio_postoffice.engines.set.ordered[fio_postoffice.engines.set.pos].obj = engine;
    pfVar2[fio_postoffice.engines.set.pos].hash = (uintptr_t)set;
    fio_postoffice.engines.set.pos = fio_postoffice.engines.set.pos + 1;
    fio_postoffice.engines.set.count = fio_postoffice.engines.set.count + 1;
    fio_engine_set_rehash(pfVar4);
  }
  else if (pfVar3->pos == (fio_engine_set__ordered_s_ *)0x0) {
    pfVar3->pos = fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos;
    fio_postoffice.engines.set.pos = fio_postoffice.engines.set.pos + 1;
    fio_postoffice.engines.set.count = fio_postoffice.engines.set.count + 1;
    pfVar3->hash = (uintptr_t)set;
    pfVar2[uVar1].hash = (uintptr_t)set;
    pfVar2[uVar1].obj = engine;
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  fio_pubsub_reattach(engine);
  return;
}

Assistant:

void fio_pubsub_attach(fio_pubsub_engine_s *engine) {
  fio_lock(&fio_postoffice.engines.lock);
  fio_engine_set_insert(&fio_postoffice.engines.set, (uintptr_t)engine, engine);
  fio_unlock(&fio_postoffice.engines.lock);
  fio_pubsub_reattach(engine);
}